

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeDeleteRowid(Rtree *pRtree,sqlite3_int64 iDelete)

{
  RtreeNode *pNode;
  ushort uVar1;
  int iVar2;
  int iVar3;
  i64 iVar4;
  RtreeNode *pRVar5;
  uint uVar6;
  bool bVar7;
  int iCell;
  RtreeNode *pRoot;
  RtreeNode *pInsert;
  RtreeNode *pChild;
  int local_84;
  RtreeNode *local_80;
  RtreeNode *local_78;
  RtreeNode *local_70;
  RtreeNode *local_68;
  RtreeCell local_60;
  
  local_70 = (RtreeNode *)0x0;
  local_78 = (RtreeNode *)0x0;
  iVar2 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_78);
  if (iVar2 == 0) {
    iVar2 = findLeafNode(pRtree,iDelete,&local_70,(sqlite3_int64 *)0x0);
    pRVar5 = local_70;
    if (local_70 != (RtreeNode *)0x0 && iVar2 == 0) {
      iVar3 = nodeRowidIndex(pRtree,(RtreeNode *)local_70->zData,iDelete,&local_84);
      if (iVar3 == 0) {
        iVar3 = deleteCell(pRtree,pRVar5,local_84,0);
      }
      iVar2 = nodeRelease(pRtree,pRVar5);
      if (iVar3 != 0) {
        iVar2 = iVar3;
      }
    }
    if (iVar2 == 0) {
      sqlite3_bind_int64(pRtree->pDeleteRowid,1,iDelete);
      sqlite3_step(pRtree->pDeleteRowid);
      iVar2 = sqlite3_reset(pRtree->pDeleteRowid);
      pRVar5 = local_78;
      if (((iVar2 == 0) && (iVar2 = 0, 0 < pRtree->iDepth)) &&
         (uVar1 = *(ushort *)(local_78->zData + 2), (ushort)(uVar1 << 8 | uVar1 >> 8) == 1)) {
        local_60.iRowid = 0;
        iVar4 = readInt64(local_78->zData + 4);
        iVar3 = nodeAcquire(pRtree,iVar4,pRVar5,(RtreeNode **)&local_60);
        iVar4 = local_60.iRowid;
        if (iVar3 == 0) {
          iVar3 = removeNode(pRtree,(RtreeNode *)local_60.iRowid,pRtree->iDepth + -1);
        }
        iVar2 = nodeRelease(pRtree,(RtreeNode *)iVar4);
        if (iVar3 != 0) {
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = pRtree->iDepth + -1;
          pRtree->iDepth = iVar3;
          uVar1 = (ushort)iVar3;
          *(ushort *)pRVar5->zData = uVar1 << 8 | uVar1 >> 8;
          pRVar5->isDirty = 1;
        }
      }
    }
  }
  pRVar5 = pRtree->pDeleted;
  if (pRVar5 != (RtreeNode *)0x0) {
    do {
      if (iVar2 == 0) {
        uVar1 = *(ushort *)(pRVar5->zData + 2) << 8 | *(ushort *)(pRVar5->zData + 2) >> 8;
        if (uVar1 == 0) {
          iVar2 = 0;
        }
        else {
          uVar6 = 1;
          local_80 = pRVar5;
          while( true ) {
            pRVar5 = local_80;
            nodeGetCell(pRtree,(RtreeNode *)local_80->zData,uVar6 - 1,&local_60);
            iVar2 = ChooseLeaf(pRtree,&local_60,(int)pRVar5->iNode,&local_68);
            pNode = local_68;
            if (iVar2 != 0) break;
            iVar3 = rtreeInsertCell(pRtree,local_68,&local_60,(int)pRVar5->iNode);
            iVar2 = nodeRelease(pRtree,pNode);
            if (iVar3 != 0) {
              iVar2 = iVar3;
            }
            pRVar5 = local_80;
            if ((iVar2 != 0) || (bVar7 = uVar1 <= uVar6, uVar6 = uVar6 + 1, bVar7)) break;
          }
        }
      }
      pRtree->pDeleted = pRVar5->pNext;
      pRtree->nNodeRef = pRtree->nNodeRef - 1;
      sqlite3_free(pRVar5);
      pRVar5 = pRtree->pDeleted;
    } while (pRVar5 != (RtreeNode *)0x0);
  }
  iVar3 = nodeRelease(pRtree,local_78);
  if (iVar2 != 0) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int rtreeDeleteRowid(Rtree *pRtree, sqlite3_int64 iDelete){
  int rc;                         /* Return code */
  RtreeNode *pLeaf = 0;           /* Leaf node containing record iDelete */
  int iCell;                      /* Index of iDelete cell in pLeaf */
  RtreeNode *pRoot = 0;           /* Root node of rtree structure */


  /* Obtain a reference to the root node to initialize Rtree.iDepth */
  rc = nodeAcquire(pRtree, 1, 0, &pRoot);

  /* Obtain a reference to the leaf node that contains the entry 
  ** about to be deleted. 
  */
  if( rc==SQLITE_OK ){
    rc = findLeafNode(pRtree, iDelete, &pLeaf, 0);
  }

#ifdef CORRUPT_DB
  assert( pLeaf!=0 || rc!=SQLITE_OK || CORRUPT_DB );
#endif

  /* Delete the cell in question from the leaf node. */
  if( rc==SQLITE_OK && pLeaf ){
    int rc2;
    rc = nodeRowidIndex(pRtree, pLeaf, iDelete, &iCell);
    if( rc==SQLITE_OK ){
      rc = deleteCell(pRtree, pLeaf, iCell, 0);
    }
    rc2 = nodeRelease(pRtree, pLeaf);
    if( rc==SQLITE_OK ){
      rc = rc2;
    }
  }

  /* Delete the corresponding entry in the <rtree>_rowid table. */
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pRtree->pDeleteRowid, 1, iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    rc = sqlite3_reset(pRtree->pDeleteRowid);
  }

  /* Check if the root node now has exactly one child. If so, remove
  ** it, schedule the contents of the child for reinsertion and 
  ** reduce the tree height by one.
  **
  ** This is equivalent to copying the contents of the child into
  ** the root node (the operation that Gutman's paper says to perform 
  ** in this scenario).
  */
  if( rc==SQLITE_OK && pRtree->iDepth>0 && NCELL(pRoot)==1 ){
    int rc2;
    RtreeNode *pChild = 0;
    i64 iChild = nodeGetRowid(pRtree, pRoot, 0);
    rc = nodeAcquire(pRtree, iChild, pRoot, &pChild);
    if( rc==SQLITE_OK ){
      rc = removeNode(pRtree, pChild, pRtree->iDepth-1);
    }
    rc2 = nodeRelease(pRtree, pChild);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK ){
      pRtree->iDepth--;
      writeInt16(pRoot->zData, pRtree->iDepth);
      pRoot->isDirty = 1;
    }
  }

  /* Re-insert the contents of any underfull nodes removed from the tree. */
  for(pLeaf=pRtree->pDeleted; pLeaf; pLeaf=pRtree->pDeleted){
    if( rc==SQLITE_OK ){
      rc = reinsertNodeContent(pRtree, pLeaf);
    }
    pRtree->pDeleted = pLeaf->pNext;
    pRtree->nNodeRef--;
    sqlite3_free(pLeaf);
  }

  /* Release the reference to the root node. */
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRoot);
  }else{
    nodeRelease(pRtree, pRoot);
  }

  return rc;
}